

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextProcessDock(ImGuiContext *ctx,ImGuiDockRequest *req)

{
  ImGuiTabItemFlags *pIVar1;
  byte *pbVar2;
  ImGuiWindow **ppIVar3;
  uint uVar4;
  ImGuiDockNodeFlags IVar5;
  int iVar6;
  ImGuiID IVar7;
  ImGuiWindow *window;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImGuiID *pIVar10;
  ImGuiDockNode *node;
  ImGuiDockNode *pIVar11;
  ulong uVar12;
  ImGuiDockNode *pIVar13;
  ImGuiDockNode *pIVar14;
  ImGuiDockNode *src_node;
  long lVar15;
  ImGuiID IVar16;
  ImGuiWindow *window_00;
  ImGuiDockNode *pIVar17;
  bool bVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  bool local_79;
  
  if (req->Type == ImGuiDockRequestType_Split) {
    if (req->DockPayload != (ImGuiWindow *)0x0) goto LAB_0013aa7d;
    window_00 = (ImGuiWindow *)0x0;
  }
  else if ((req->Type != ImGuiDockRequestType_Dock) ||
          (window_00 = req->DockPayload, window_00 == (ImGuiWindow *)0x0)) {
LAB_0013aa7d:
    __assert_fail("(req->Type == ImGuiDockRequestType_Dock && req->DockPayload != __null) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == __null)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3007,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  window = req->DockTargetWindow;
  node = req->DockTargetNode;
  if (window == (ImGuiWindow *)0x0 && node == (ImGuiDockNode *)0x0) {
    __assert_fail("req->DockTargetWindow != __null || req->DockTargetNode != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3008,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  IVar16 = 0;
  if (window_00 == (ImGuiWindow *)0x0) {
    src_node = (ImGuiDockNode *)0x0;
  }
  else {
    src_node = window_00->DockNodeAsHost;
    window_00->DockNodeAsHost = (ImGuiDockNode *)0x0;
    if (src_node == (ImGuiDockNode *)0x0) {
      pIVar10 = &window_00->ID;
      src_node = (ImGuiDockNode *)0x0;
LAB_0013a5be:
      IVar16 = *pIVar10;
    }
    else {
      IVar16 = 0;
      if (src_node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
        IVar16 = src_node->TabBar->NextSelectedTabId;
        if (IVar16 == 0) {
          pIVar10 = &src_node->TabBar->SelectedTabId;
          goto LAB_0013a5be;
        }
      }
    }
  }
  if (node == (ImGuiDockNode *)0x0) {
    node = DockContextAddNode(ctx,0);
    node->Pos = window->Pos;
    node->Size = window->Size;
    if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      DockNodeAddWindow(node,window,true);
      if ((node->TabBar->Tabs).Size < 1) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5c2,"T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]");
      }
      pIVar1 = &((node->TabBar->Tabs).Data)->Flags;
      *pIVar1 = *pIVar1 & 0xffbfffff;
      window->field_0x492 = window->field_0x492 | 1;
    }
  }
  else {
    if (ctx->FrameCount < node->LastFrameAlive) {
      __assert_fail("node->LastFrameAlive <= g.FrameCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x3025,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                   );
    }
    if ((((window != (ImGuiWindow *)0x0) && (node == window->DockNodeAsHost)) &&
        ((node->Windows).Size < 1)) &&
       ((node->ChildNodes[0] == (ImGuiDockNode *)0x0 && ((node->LocalFlags & 0x800) == 0)))) {
      __assert_fail("node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x3027,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                   );
    }
  }
  pIVar9 = GImGui;
  uVar4 = req->DockSplitDir;
  if (uVar4 != 0xffffffff) {
    fVar21 = req->DockSplitRatio;
    if (src_node == (ImGuiDockNode *)0x0 || (uVar4 & 0xfffffffd) != 0) {
      local_79 = (uVar4 & 0xfffffffd) != 0;
      pIVar13 = DockContextAddNode(ctx,0);
      pIVar13->ParentNode = node;
      pIVar11 = src_node;
      if (src_node == (ImGuiDockNode *)0x0 || !local_79) goto LAB_0013a71f;
    }
    else {
      local_79 = (uVar4 & 0xfffffffd) != 0;
      src_node->ParentNode = node;
      pIVar13 = src_node;
LAB_0013a71f:
      pIVar11 = DockContextAddNode(ctx,0);
    }
    bVar18 = (uVar4 & 0xfffffffd) == 0;
    pIVar11->ParentNode = node;
    pIVar17 = pIVar13;
    if (bVar18) {
      pIVar17 = pIVar11;
    }
    DockNodeMoveChildNodes(pIVar17,node);
    node->ChildNodes[0] = pIVar13;
    node->ChildNodes[1] = pIVar11;
    node->ChildNodes[bVar18]->VisibleWindow = node->VisibleWindow;
    node->SplitAxis = (uint)(1 < uVar4);
    node->VisibleWindow = (ImGuiWindow *)0x0;
    *(ushort *)&node->field_0xb8 = (ushort)*(undefined4 *)&node->field_0xb8 & 0xffc0 | 9;
    uVar12 = (ulong)((uint)(1 < uVar4) * 4);
    fVar20 = *(float *)((long)node->ChildNodes + uVar12 + 0x30) + -2.0;
    fVar22 = *(float *)((long)&(pIVar9->Style).WindowMinSize.x + uVar12);
    fVar22 = fVar22 + fVar22;
    uVar19 = -(uint)(fVar22 <= fVar20);
    fVar22 = (float)(~uVar19 & (uint)fVar22 | (uint)fVar20 & uVar19);
    if (fVar22 <= 0.0) {
      __assert_fail("size_avail > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x365f,
                    "void ImGui::DockNodeTreeSplit(ImGuiContext *, ImGuiDockNode *, ImGuiAxis, int, float, ImGuiDockNode *)"
                   );
    }
    IVar8 = node->Size;
    pIVar11->SizeRef = IVar8;
    pIVar13->SizeRef = IVar8;
    fVar21 = (float)(int)(fVar21 * fVar22);
    lVar15 = (ulong)(1 < uVar4) * 4;
    *(float *)((long)pIVar13->ChildNodes + lVar15 + 0x38) = fVar21;
    *(float *)((long)pIVar11->ChildNodes + lVar15 + 0x38) = (float)(int)(fVar22 - fVar21);
    DockNodeMoveWindows(node->ChildNodes[bVar18],node);
    DockNodeTreeUpdatePosSize(node,node->Pos,node->Size,false);
    IVar5 = node->SharedFlags;
    pIVar13->SharedFlags = IVar5;
    pIVar11->SharedFlags = IVar5;
    pIVar17->LocalFlags = node->LocalFlags & 0x61f870;
    node->LocalFlags = node->LocalFlags & 0xff9e078f;
    pIVar11 = node;
    if ((pIVar17->LocalFlags & 0x800) != 0) {
      do {
        pIVar13 = pIVar11;
        pIVar11 = pIVar13->ParentNode;
      } while (pIVar11 != (ImGuiDockNode *)0x0);
      pIVar13->CentralNode = pIVar17;
    }
    ppIVar3 = &node->HostWindow;
    node = node->ChildNodes[local_79];
    node->HostWindow = *ppIVar3;
  }
  pbVar2 = (byte *)((long)&node->LocalFlags + 1);
  *pbVar2 = *pbVar2 & 0xdf;
  if (node == src_node) {
    node->field_0xba = node->field_0xba | 2;
    goto LAB_0013aa42;
  }
  if ((node->Windows).Size < 1) {
LAB_0013a905:
    bVar18 = false;
  }
  else {
    bVar18 = true;
    if (node->TabBar == (ImGuiTabBar *)0x0) {
      DockNodeAddTabBar(node);
      if ((node->Windows).Size < 1) goto LAB_0013a905;
      lVar15 = 0;
      do {
        TabBarAddTab(node->TabBar,0,(node->Windows).Data[lVar15]);
        lVar15 = lVar15 + 1;
        iVar6 = (node->Windows).Size;
      } while (lVar15 < iVar6);
      bVar18 = 0 < iVar6;
    }
  }
  if (src_node == (ImGuiDockNode *)0x0) {
    if (window_00 != (ImGuiWindow *)0x0) {
      IVar7 = window_00->DockId;
      node->VisibleWindow = window_00;
      DockNodeAddWindow(node,window_00,true);
      if (IVar7 != 0) {
        DockSettingsRenameNodeReferences(IVar7,node->ID);
      }
    }
  }
  else {
    if (src_node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
      IVar7 = src_node->ID;
      DockNodeMoveWindows(node,src_node);
      DockSettingsRenameNodeReferences(IVar7,node->ID);
    }
    else {
      if (bVar18) {
        pIVar11 = src_node->OnlyNodeWithWindows;
        if (pIVar11 == (ImGuiDockNode *)0x0) {
          __assert_fail("payload_node->OnlyNodeWithWindows != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x3059,
                        "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
        }
        if ((pIVar11->TabBar != (ImGuiTabBar *)0x0) && ((pIVar11->TabBar->Tabs).Size < 1)) {
          __assert_fail("visible_node->TabBar->Tabs.Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x305c,
                        "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
        }
        DockNodeMoveWindows(node,pIVar11);
        DockNodeMoveWindows(pIVar11,node);
        DockSettingsRenameNodeReferences(node->ID,pIVar11->ID);
      }
      if ((node->LocalFlags & 0x800) != 0) {
        pIVar13 = (ImGuiDockNode *)
                  ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,src_node->LastFocusedNodeId);
        pIVar11 = pIVar13;
        if (pIVar13 == (ImGuiDockNode *)0x0) {
          __assert_fail("last_focused_node != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x3066,
                        "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
        }
        do {
          pIVar14 = pIVar11;
          pIVar11 = pIVar14->ParentNode;
          pIVar17 = src_node;
        } while (pIVar14->ParentNode != (ImGuiDockNode *)0x0);
        do {
          pIVar11 = pIVar17;
          pIVar17 = pIVar11->ParentNode;
        } while (pIVar17 != (ImGuiDockNode *)0x0);
        if (pIVar14 != pIVar11) {
          __assert_fail("last_focused_root_node == DockNodeGetRootNode(payload_node)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x3068,
                        "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
        }
        pbVar2 = (byte *)((long)&pIVar13->LocalFlags + 1);
        *pbVar2 = *pbVar2 | 8;
        pbVar2 = (byte *)((long)&node->LocalFlags + 1);
        *pbVar2 = *pbVar2 & 0xf7;
        pIVar14->CentralNode = pIVar13;
      }
      if ((node->Windows).Size != 0) {
        __assert_fail("node->Windows.Size == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x306e,
                      "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
      }
      DockNodeMoveChildNodes(node,src_node);
    }
    DockContextRemoveNode(ctx,src_node,true);
  }
LAB_0013aa42:
  if (node->TabBar != (ImGuiTabBar *)0x0) {
    node->TabBar->NextSelectedTabId = IVar16;
  }
  if (GImGui->SettingsDirtyTimer <= 0.0) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  return;
}

Assistant:

void ImGui::DockContextProcessDock(ImGuiContext* ctx, ImGuiDockRequest* req)
{
    IM_ASSERT((req->Type == ImGuiDockRequestType_Dock && req->DockPayload != NULL) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == NULL));
    IM_ASSERT(req->DockTargetWindow != NULL || req->DockTargetNode != NULL);

    ImGuiContext& g = *ctx;
    IM_UNUSED(g);

    ImGuiWindow* payload_window = req->DockPayload;     // Optional
    ImGuiWindow* target_window = req->DockTargetWindow;
    ImGuiDockNode* node = req->DockTargetNode;
    if (payload_window)
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X target '%s' dock window '%s', split_dir %d\n", node ? node->ID : 0, target_window ? target_window->Name : "NULL", payload_window ? payload_window->Name : "NULL", req->DockSplitDir);
    else
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X, split_dir %d\n", node ? node->ID : 0, req->DockSplitDir);

    // Decide which Tab will be selected at the end of the operation
    ImGuiID next_selected_id = 0;
    ImGuiDockNode* payload_node = NULL;
    if (payload_window)
    {
        payload_node = payload_window->DockNodeAsHost;
        payload_window->DockNodeAsHost = NULL; // Important to clear this as the node will have its life as a child which might be merged/deleted later.
        if (payload_node && payload_node->IsLeafNode())
            next_selected_id = payload_node->TabBar->NextSelectedTabId ? payload_node->TabBar->NextSelectedTabId : payload_node->TabBar->SelectedTabId;
        if (payload_node == NULL)
            next_selected_id = payload_window->ID;
    }

    // FIXME-DOCK: When we are trying to dock an existing single-window node into a loose window, transfer Node ID as well
    // When processing an interactive split, usually LastFrameAlive will be < g.FrameCount. But DockBuilder operations can make it ==.
    if (node)
        IM_ASSERT(node->LastFrameAlive <= g.FrameCount);
    if (node && target_window && node == target_window->DockNodeAsHost)
        IM_ASSERT(node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode());

    // Create new node and add existing window to it
    if (node == NULL)
    {
        node = DockContextAddNode(ctx, 0);
        node->Pos = target_window->Pos;
        node->Size = target_window->Size;
        if (target_window->DockNodeAsHost == NULL)
        {
            DockNodeAddWindow(node, target_window, true);
            node->TabBar->Tabs[0].Flags &= ~ImGuiTabItemFlags_Unsorted;
            target_window->DockIsActive = true;
        }
    }

    ImGuiDir split_dir = req->DockSplitDir;
    if (split_dir != ImGuiDir_None)
    {
        // Split into one, one side will be our payload node unless we are dropping a loose window
        const ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        const int split_inheritor_child_idx = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 1 : 0; // Current contents will be moved to the opposite side
        const float split_ratio = req->DockSplitRatio;
        DockNodeTreeSplit(ctx, node, split_axis, split_inheritor_child_idx, split_ratio, payload_node);  // payload_node may be NULL here!
        ImGuiDockNode* new_node = node->ChildNodes[split_inheritor_child_idx ^ 1];
        new_node->HostWindow = node->HostWindow;
        node = new_node;
    }
    node->LocalFlags &= ~ImGuiDockNodeFlags_HiddenTabBar;

    if (node != payload_node)
    {
        // Create tab bar before we call DockNodeMoveWindows (which would attempt to move the old tab-bar, which would lead us to payload tabs wrongly appearing before target tabs!)
        if (node->Windows.Size > 0 && node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            for (int n = 0; n < node->Windows.Size; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }

        if (payload_node != NULL)
        {
            // Transfer full payload node (with 1+ child windows or child nodes)
            if (payload_node->IsSplitNode())
            {
                if (node->Windows.Size > 0)
                {
                    // We can dock a split payload into a node that already has windows _only_ if our payload is a node tree with a single visible node.
                    // In this situation, we move the windows of the target node into the currently visible node of the payload.
                    // This allows us to preserve some of the underlying dock tree settings nicely.
                    IM_ASSERT(payload_node->OnlyNodeWithWindows != NULL); // The docking should have been blocked by DockNodePreviewDockSetup() early on and never submitted.
                    ImGuiDockNode* visible_node = payload_node->OnlyNodeWithWindows;
                    if (visible_node->TabBar)
                        IM_ASSERT(visible_node->TabBar->Tabs.Size > 0);
                    DockNodeMoveWindows(node, visible_node);
                    DockNodeMoveWindows(visible_node, node);
                    DockSettingsRenameNodeReferences(node->ID, visible_node->ID);
                }
                if (node->IsCentralNode())
                {
                    // Central node property needs to be moved to a leaf node, pick the last focused one.
                    // FIXME-DOCK: If we had to transfer other flags here, what would the policy be?
                    ImGuiDockNode* last_focused_node = DockContextFindNodeByID(ctx, payload_node->LastFocusedNodeId);
                    IM_ASSERT(last_focused_node != NULL);
                    ImGuiDockNode* last_focused_root_node = DockNodeGetRootNode(last_focused_node);
                    IM_ASSERT(last_focused_root_node == DockNodeGetRootNode(payload_node));
                    last_focused_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
                    node->LocalFlags &= ~ImGuiDockNodeFlags_CentralNode;
                    last_focused_root_node->CentralNode = last_focused_node;
                }

                IM_ASSERT(node->Windows.Size == 0);
                DockNodeMoveChildNodes(node, payload_node);
            }
            else
            {
                const ImGuiID payload_dock_id = payload_node->ID;
                DockNodeMoveWindows(node, payload_node);
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
            }
            DockContextRemoveNode(ctx, payload_node, true);
        }
        else if (payload_window)
        {
            // Transfer single window
            const ImGuiID payload_dock_id = payload_window->DockId;
            node->VisibleWindow = payload_window;
            DockNodeAddWindow(node, payload_window, true);
            if (payload_dock_id != 0)
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
        }
    }
    else
    {
        // When docking a floating single window node we want to reevaluate auto-hiding of the tab bar
        node->WantHiddenTabBarUpdate = true;
    }

    // Update selection immediately
    if (ImGuiTabBar* tab_bar = node->TabBar)
        tab_bar->NextSelectedTabId = next_selected_id;
    MarkIniSettingsDirty();
}